

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

string * __thiscall
OpenMD::SelectionCompiler::getUnescapedStringLiteral_abi_cxx11_
          (string *__return_storage_ptr__,SelectionCompiler *this)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  iVar4 = this->cchToken;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)iVar4 + -2);
  iVar7 = this->ichToken + this->cchToken + -1;
  iVar4 = this->ichToken + 1;
  do {
    if (iVar7 <= iVar4) {
      return __return_storage_ptr__;
    }
    pcVar2 = (this->script)._M_dataplus._M_p;
    uVar8 = (long)iVar4 + 1;
    if ((pcVar2[iVar4] == '\\') && ((int)uVar8 < iVar7)) {
      uVar5 = iVar4 + 2;
      switch(pcVar2[uVar8]) {
      case 'n':
        break;
      case 'o':
      case 'p':
      case 'q':
      case 's':
      case 'v':
      case 'w':
        break;
      case 'r':
        break;
      case 't':
        break;
      case 'u':
      case 'x':
        if ((int)uVar5 < iVar7) {
          iVar4 = (uint)(pcVar2[uVar8] != 'x') * 2 + 2;
          uVar3 = (long)(int)uVar5;
          do {
            uVar8 = uVar3;
            if ((iVar4 < 1) || ((long)iVar7 <= (long)uVar8)) break;
            cVar1 = pcVar2[uVar8];
            iVar6 = (int)cVar1;
            if ((byte)(cVar1 - 0x30U) < 10) {
              iVar6 = iVar6 + -0x30;
            }
            else if ((byte)(cVar1 + 0x9fU) < 6) {
              iVar6 = iVar6 + -0x57;
            }
            else {
              if (5 < (byte)(cVar1 + 0xbfU)) break;
              iVar6 = iVar6 + -0x37;
            }
            iVar4 = iVar4 + -1;
            uVar3 = uVar8 + 1;
          } while (-1 < iVar6);
          goto LAB_0026b0f5;
        }
        break;
      default:
      }
      uVar8 = (ulong)uVar5;
    }
LAB_0026b0f5:
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
    iVar4 = (int)uVar8;
  } while( true );
}

Assistant:

std::string SelectionCompiler::getUnescapedStringLiteral() {
    /** @todo */
    std::string sb(cchToken - 2, ' ');

    int ichMax = ichToken + cchToken - 1;
    int ich    = ichToken + 1;

    while (ich < ichMax) {
      char ch = script[ich++];
      if (ch == '\\' && ich < ichMax) {
        ch = script[ich++];
        switch (ch) {
        case 'b':
          ch = '\b';
          break;
        case 'n':
          ch = '\n';
          break;
        case 't':
          ch = '\t';
          break;
        case 'r':
          ch = '\r';
          // fall into
        case '"':
        case '\\':
        case '\'':
          break;
        case 'x':
        case 'u':
          int digitCount = ch == 'x' ? 2 : 4;
          if (ich < ichMax) {
            int unicode = 0;
            for (int k = digitCount; --k >= 0 && ich < ichMax;) {
              char chT  = script[ich];
              int hexit = getHexitValue(chT);
              if (hexit < 0) break;
              unicode <<= 4;
              unicode += hexit;
              ++ich;
            }
            ch = (char)unicode;
          }
        }
      }
      sb.append(1, ch);
    }

    return sb;
  }